

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigRemoveClass(Ivy_FraigList_t *pList,Ivy_Obj_t *pClass)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pClass_local;
  Ivy_FraigList_t *pList_local;
  
  if (pList->pHead == pClass) {
    pIVar1 = Ivy_ObjEquivListNext(pClass);
    pList->pHead = pIVar1;
  }
  if (pList->pTail == pClass) {
    pIVar1 = Ivy_ObjEquivListPrev(pClass);
    pList->pTail = pIVar1;
  }
  pIVar1 = Ivy_ObjEquivListPrev(pClass);
  if (pIVar1 != (Ivy_Obj_t *)0x0) {
    pIVar1 = Ivy_ObjEquivListPrev(pClass);
    pIVar2 = Ivy_ObjEquivListNext(pClass);
    Ivy_ObjSetEquivListNext(pIVar1,pIVar2);
  }
  pIVar1 = Ivy_ObjEquivListNext(pClass);
  if (pIVar1 != (Ivy_Obj_t *)0x0) {
    pIVar1 = Ivy_ObjEquivListNext(pClass);
    pIVar2 = Ivy_ObjEquivListPrev(pClass);
    Ivy_ObjSetEquivListPrev(pIVar1,pIVar2);
  }
  Ivy_ObjSetEquivListNext(pClass,(Ivy_Obj_t *)0x0);
  Ivy_ObjSetEquivListPrev(pClass,(Ivy_Obj_t *)0x0);
  *(uint *)&pClass->field_0x8 = *(uint *)&pClass->field_0x8 & 0xffffffef;
  pList->nItems = pList->nItems + -1;
  return;
}

Assistant:

void Ivy_FraigRemoveClass( Ivy_FraigList_t * pList, Ivy_Obj_t * pClass )
{
    if ( pList->pHead == pClass )
        pList->pHead = Ivy_ObjEquivListNext(pClass);
    if ( pList->pTail == pClass )
        pList->pTail = Ivy_ObjEquivListPrev(pClass);
    if ( Ivy_ObjEquivListPrev(pClass) )
        Ivy_ObjSetEquivListNext( Ivy_ObjEquivListPrev(pClass), Ivy_ObjEquivListNext(pClass) ); 
    if ( Ivy_ObjEquivListNext(pClass) )
        Ivy_ObjSetEquivListPrev( Ivy_ObjEquivListNext(pClass), Ivy_ObjEquivListPrev(pClass) );
    Ivy_ObjSetEquivListNext( pClass, NULL ); 
    Ivy_ObjSetEquivListPrev( pClass, NULL );
    pClass->fMarkA = 0;
    pList->nItems--;
}